

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measure.cpp
# Opt level: O0

void __thiscall
icu_63::Measure::Measure(Measure *this,Formattable *_number,MeasureUnit *adoptedUnit,UErrorCode *ec)

{
  UBool UVar1;
  UErrorCode *ec_local;
  MeasureUnit *adoptedUnit_local;
  Formattable *_number_local;
  Measure *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Measure_004a9c10;
  Formattable::Formattable(&this->number,_number);
  this->unit = adoptedUnit;
  UVar1 = ::U_SUCCESS(*ec);
  if (UVar1 != '\0') {
    UVar1 = Formattable::isNumeric(&this->number);
    if ((UVar1 == '\0') || (adoptedUnit == (MeasureUnit *)0x0)) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

Measure::Measure(const Formattable& _number, MeasureUnit* adoptedUnit,
                 UErrorCode& ec) :
    number(_number), unit(adoptedUnit) {
    if (U_SUCCESS(ec) &&
        (!number.isNumeric() || adoptedUnit == 0)) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
}